

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O3

CharString * __thiscall
CFFFileInput::GetGlyphCharString
          (CFFFileInput *this,unsigned_short inFontIndex,unsigned_short inCharStringIndex)

{
  ushort uVar1;
  Trace *this_00;
  ulong uVar2;
  char *inFormat;
  
  if (inFontIndex < this->mFontsCount) {
    if (inCharStringIndex < this->mCharStrings[inFontIndex].mCharStringsCount) {
      return (CharString *)
             ((long)&(this->mCharStrings[inFontIndex].mCharStringsIndex)->mStartPosition +
             (ulong)((uint)inCharStringIndex * 0x18));
    }
    uVar2 = (ulong)inCharStringIndex;
    this_00 = Trace::DefaultTrace();
    uVar1 = this->mCharStrings[inFontIndex].mCharStringsCount;
    inFormat = 
    "CFFFileInput::CalculateDependenciesForCharIndex, inCharStringIndex = %d is invalid. there are %d charsringd in the CFF segment for the requested font"
    ;
  }
  else {
    uVar2 = (ulong)inFontIndex;
    this_00 = Trace::DefaultTrace();
    uVar1 = this->mFontsCount;
    inFormat = 
    "CFFFileInput::CalculateDependenciesForCharIndex, inFontIndex = %d is invalid. there are %d fonts in the CFF segment"
    ;
  }
  Trace::TraceToLog(this_00,inFormat,uVar2,(ulong)uVar1);
  return (CharString *)0x0;
}

Assistant:

CharString* CFFFileInput::GetGlyphCharString(unsigned short inFontIndex,
											 unsigned short inCharStringIndex)
{
	if(inFontIndex >= mFontsCount)
	{
		TRACE_LOG2("CFFFileInput::CalculateDependenciesForCharIndex, inFontIndex = %d is invalid. there are %d fonts in the CFF segment",inFontIndex,mFontsCount);
		return NULL;
	}

	if(mCharStrings[inFontIndex].mCharStringsCount <= inCharStringIndex)
	{
		TRACE_LOG2("CFFFileInput::CalculateDependenciesForCharIndex, inCharStringIndex = %d is invalid. there are %d charsringd in the CFF segment for the requested font",
																														inCharStringIndex,mCharStrings[inFontIndex].mCharStringsCount);
		return NULL;
	}

	return mCharStrings[inFontIndex].mCharStringsIndex + inCharStringIndex;
}